

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodetxb_sse2.c
# Opt level: O2

void get_16n_coeff_contexts_2d
               (uint8_t *levels,int real_width,int real_height,int width,int height,
               ptrdiff_t *offsets,int8_t *coeff_contexts)

{
  char *pcVar1;
  long lVar2;
  long lVar3;
  int8_t *piVar4;
  char extraout_XMM0_Ba;
  char extraout_XMM0_Bb;
  char extraout_XMM0_Bc;
  char extraout_XMM0_Bd;
  char extraout_XMM0_Be;
  char extraout_XMM0_Bf;
  char extraout_XMM0_Bg;
  undefined8 uVar5;
  undefined8 uVar6;
  char extraout_XMM0_Bh;
  char extraout_XMM0_Bi;
  char extraout_XMM0_Bj;
  char extraout_XMM0_Bk;
  char extraout_XMM0_Bl;
  char extraout_XMM0_Bm;
  char extraout_XMM0_Bn;
  char extraout_XMM0_Bo;
  char extraout_XMM0_Bp;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined8 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  __m128i level [5];
  undefined8 local_108;
  undefined4 local_c8;
  undefined4 uStack_c4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  char local_98;
  char cStack_97;
  char cStack_96;
  char cStack_95;
  char cStack_94;
  char cStack_93;
  char cStack_92;
  char cStack_91;
  char cStack_90;
  char cStack_8f;
  char cStack_8e;
  char cStack_8d;
  char cStack_8c;
  char cStack_8b;
  char cStack_8a;
  char cStack_89;
  longlong local_88;
  longlong lStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  uVar10 = 0x1515151515150606;
  uVar5 = 0x1515151515151506;
  uVar7 = 0x15151515;
  if (real_width == real_height) {
    uVar16 = 0x15151515;
    uStack_c0 = 0x15151515;
    uStack_bc = 0x15151515;
    local_108 = 0x1515151515151515;
    local_c8 = 0x15060601;
    uVar15 = 0x6060100;
  }
  else if (real_width < real_height) {
    uVar16 = 0x15151515;
    uStack_c0 = 0x15151515;
    uStack_bc = 0x15151515;
    uVar5 = 0x1515151515150b0b;
    local_108 = 0x1515151515150b0b;
    local_c8 = 0x15060b0b;
    uVar15 = 0x6060b00;
    uVar10 = uVar5;
  }
  else {
    uVar7 = 0x10101010;
    uVar16 = 0x10101010;
    uStack_c0 = 0x10101010;
    uStack_bc = 0x10101010;
    local_108 = 0x1515151515151515;
    local_c8 = uVar7;
    uVar15 = uVar7;
  }
  piVar4 = coeff_contexts;
  uStack_c4 = uVar16;
  uVar17 = uVar16;
  uVar18 = uVar7;
  uVar19 = uVar16;
  uVar20 = uStack_c0;
  uVar21 = uStack_bc;
  do {
    uVar6 = uVar5;
    uVar14 = uStack_bc;
    uVar13 = uStack_c0;
    uVar12 = uStack_c4;
    uVar11 = local_c8;
    uVar9 = uVar16;
    uVar8 = uVar7;
    lVar3 = 0;
    do {
      lVar2 = lVar3;
      local_88 = *(longlong *)(levels + lVar2 + 1);
      lStack_80 = *(longlong *)((long)(levels + lVar2 + 1) + 8);
      local_78 = *(undefined8 *)(levels + lVar2 + (long)height + 4);
      uStack_70 = *(undefined8 *)(levels + lVar2 + (long)height + 4 + 8);
      local_68 = *(undefined8 *)(levels + *offsets + lVar2);
      uStack_60 = *(undefined8 *)(levels + *offsets + lVar2 + 8);
      local_58 = *(undefined8 *)(levels + offsets[1] + lVar2);
      uStack_50 = *(undefined8 *)(levels + offsets[1] + lVar2 + 8);
      local_48 = *(undefined8 *)(levels + offsets[2] + lVar2);
      uStack_40 = *(undefined8 *)(levels + offsets[2] + lVar2 + 8);
      get_coeff_contexts_kernel_sse2((__m128i *)&local_88);
      local_98 = (char)uVar15;
      cStack_97 = (char)((uint)uVar15 >> 8);
      cStack_96 = (char)((uint)uVar15 >> 0x10);
      cStack_95 = (char)((uint)uVar15 >> 0x18);
      cStack_94 = (char)uVar17;
      cStack_93 = (char)((uint)uVar17 >> 8);
      cStack_92 = (char)((uint)uVar17 >> 0x10);
      cStack_91 = (char)((uint)uVar17 >> 0x18);
      cStack_90 = (char)uVar20;
      cStack_8f = (char)((uint)uVar20 >> 8);
      cStack_8e = (char)((uint)uVar20 >> 0x10);
      cStack_8d = (char)((uint)uVar20 >> 0x18);
      cStack_8c = (char)uVar21;
      cStack_8b = (char)((uint)uVar21 >> 8);
      cStack_8a = (char)((uint)uVar21 >> 0x10);
      cStack_89 = (char)((uint)uVar21 >> 0x18);
      pcVar1 = piVar4 + lVar2;
      *pcVar1 = extraout_XMM0_Ba + local_98;
      pcVar1[1] = extraout_XMM0_Bb + cStack_97;
      pcVar1[2] = extraout_XMM0_Bc + cStack_96;
      pcVar1[3] = extraout_XMM0_Bd + cStack_95;
      pcVar1[4] = extraout_XMM0_Be + cStack_94;
      pcVar1[5] = extraout_XMM0_Bf + cStack_93;
      pcVar1[6] = extraout_XMM0_Bg + cStack_92;
      pcVar1[7] = extraout_XMM0_Bh + cStack_91;
      pcVar1[8] = extraout_XMM0_Bi + cStack_90;
      pcVar1[9] = extraout_XMM0_Bj + cStack_8f;
      pcVar1[10] = extraout_XMM0_Bk + cStack_8e;
      pcVar1[0xb] = extraout_XMM0_Bl + cStack_8d;
      pcVar1[0xc] = extraout_XMM0_Bm + cStack_8c;
      pcVar1[0xd] = extraout_XMM0_Bn + cStack_8b;
      pcVar1[0xe] = extraout_XMM0_Bo + cStack_8a;
      pcVar1[0xf] = extraout_XMM0_Bp + cStack_89;
      lVar3 = lVar2 + 0x10;
      uVar15 = uVar18;
      uVar17 = uVar19;
    } while (height != (int)lVar3);
    levels = levels + lVar2 + 0x14;
    piVar4 = piVar4 + lVar3;
    width = width + -1;
    local_c8 = (undefined4)uVar10;
    uStack_c4 = (undefined4)((ulong)uVar10 >> 0x20);
    uStack_c0 = 0x15151515;
    uStack_bc = 0x15151515;
    uVar7 = 0x15151515;
    uVar16 = 0x15151515;
    uVar15 = uVar11;
    uVar17 = uVar12;
    uVar18 = uVar8;
    uVar19 = uVar9;
    uVar20 = uVar13;
    uVar21 = uVar14;
    uVar5 = local_108;
    uVar10 = uVar6;
  } while (width != 0);
  *coeff_contexts = '\0';
  return;
}

Assistant:

static inline void get_16n_coeff_contexts_2d(const uint8_t *levels,
                                             const int real_width,
                                             const int real_height,
                                             const int width, const int height,
                                             const ptrdiff_t *const offsets,
                                             int8_t *coeff_contexts) {
  const int stride = height + TX_PAD_HOR;
  int8_t *cc = coeff_contexts;
  int col = width;
  __m128i pos_to_offset[5];
  __m128i pos_to_offset_large[3];
  __m128i count;
  __m128i level[5];

  assert(!(height % 16));

  pos_to_offset_large[2] = _mm_set1_epi8(21);
  if (real_width == real_height) {
    pos_to_offset[0] = _mm_setr_epi8(0, 1, 6, 6, 21, 21, 21, 21, 21, 21, 21, 21,
                                     21, 21, 21, 21);
    pos_to_offset[1] = _mm_setr_epi8(1, 6, 6, 21, 21, 21, 21, 21, 21, 21, 21,
                                     21, 21, 21, 21, 21);
    pos_to_offset[2] = _mm_setr_epi8(6, 6, 21, 21, 21, 21, 21, 21, 21, 21, 21,
                                     21, 21, 21, 21, 21);
    pos_to_offset[3] = _mm_setr_epi8(6, 21, 21, 21, 21, 21, 21, 21, 21, 21, 21,
                                     21, 21, 21, 21, 21);
    pos_to_offset[4] = pos_to_offset_large[0] = pos_to_offset_large[1] =
        pos_to_offset_large[2];
  } else if (real_width < real_height) {
    pos_to_offset[0] = _mm_setr_epi8(0, 11, 6, 6, 21, 21, 21, 21, 21, 21, 21,
                                     21, 21, 21, 21, 21);
    pos_to_offset[1] = _mm_setr_epi8(11, 11, 6, 21, 21, 21, 21, 21, 21, 21, 21,
                                     21, 21, 21, 21, 21);
    pos_to_offset[2] = pos_to_offset[3] = pos_to_offset[4] = _mm_setr_epi8(
        11, 11, 21, 21, 21, 21, 21, 21, 21, 21, 21, 21, 21, 21, 21, 21);
    pos_to_offset_large[0] = pos_to_offset_large[1] = pos_to_offset_large[2];
  } else {  // real_width > real_height
    pos_to_offset[0] = pos_to_offset[1] = _mm_setr_epi8(
        16, 16, 16, 16, 16, 16, 16, 16, 16, 16, 16, 16, 16, 16, 16, 16);
    pos_to_offset[2] = _mm_setr_epi8(6, 6, 21, 21, 21, 21, 21, 21, 21, 21, 21,
                                     21, 21, 21, 21, 21);
    pos_to_offset[3] = _mm_setr_epi8(6, 21, 21, 21, 21, 21, 21, 21, 21, 21, 21,
                                     21, 21, 21, 21, 21);
    pos_to_offset[4] = pos_to_offset_large[2];
    pos_to_offset_large[0] = pos_to_offset_large[1] = _mm_set1_epi8(16);
  }

  do {
    int h = height;

    do {
      load_levels_16x1x5_sse2(levels, stride, offsets, level);
      count = get_coeff_contexts_kernel_sse2(level);
      count = _mm_add_epi8(count, pos_to_offset[0]);
      _mm_store_si128((__m128i *)cc, count);
      levels += 16;
      cc += 16;
      h -= 16;
      pos_to_offset[0] = pos_to_offset_large[0];
    } while (h);

    pos_to_offset[0] = pos_to_offset[1];
    pos_to_offset[1] = pos_to_offset[2];
    pos_to_offset[2] = pos_to_offset[3];
    pos_to_offset[3] = pos_to_offset[4];
    pos_to_offset_large[0] = pos_to_offset_large[1];
    pos_to_offset_large[1] = pos_to_offset_large[2];
    levels += TX_PAD_HOR;
  } while (--col);

  coeff_contexts[0] = 0;
}